

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QMultiHash<QString,_QCss::StyleRule> * __thiscall
QMultiHash<QString,_QCss::StyleRule>::operator=
          (QMultiHash<QString,_QCss::StyleRule> *this,QMultiHash<QString,_QCss::StyleRule> *other)

{
  Data *pDVar1;
  Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *this_00;
  Data *pDVar2;
  Data *o;
  
  pDVar2 = this->d;
  pDVar1 = other->d;
  if (pDVar2 != pDVar1) {
    if ((pDVar1 != (Data *)0x0) && (*(int *)pDVar1 != -1)) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + 1;
      UNLOCK();
      pDVar2 = this->d;
    }
    if ((pDVar2 != (Data *)0x0) && (*(int *)pDVar2 != -1)) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if (*(int *)pDVar2 == 0) {
        this_00 = this->d;
        if (this_00 != (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0) {
          QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::~Data(this_00);
        }
        operator_delete(this_00,0x28);
      }
    }
    this->d = pDVar1;
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

QMultiHash &operator=(const QMultiHash &other) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (d != other.d) {
            Data *o = other.d;
            if (o)
                o->ref.ref();
            if (d && !d->ref.deref())
                delete d;
            d = o;
            m_size = other.m_size;
        }
        return *this;
    }